

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

nng_err http_server_set_err(nni_http_server *s,nng_http_status code,char *body)

{
  void *local_30;
  http_error *epage;
  char *body_local;
  nng_http_status code_local;
  nni_http_server *s_local;
  
  nni_mtx_lock(&s->errors_mtx);
  for (local_30 = nni_list_first(&s->errors);
      (local_30 != (void *)0x0 && (*(nng_http_status *)((long)local_30 + 0x10) != code));
      local_30 = nni_list_next(&s->errors,local_30)) {
  }
  if (local_30 == (void *)0x0) {
    local_30 = nni_zalloc(0x20);
    if (local_30 == (void *)0x0) {
      nni_mtx_unlock(&s->mtx);
      return NNG_ENOMEM;
    }
    *(nng_http_status *)((long)local_30 + 0x10) = code;
    nni_list_append(&s->errors,local_30);
  }
  nni_strfree(*(char **)((long)local_30 + 0x18));
  *(char **)((long)local_30 + 0x18) = body;
  nni_mtx_unlock(&s->errors_mtx);
  return NNG_OK;
}

Assistant:

static nng_err
http_server_set_err(nni_http_server *s, nng_http_status code, char *body)
{
	http_error *epage;

	nni_mtx_lock(&s->errors_mtx);
	NNI_LIST_FOREACH (&s->errors, epage) {
		if (epage->code == code) {
			break;
		}
	}
	if (epage == NULL) {
		if ((epage = NNI_ALLOC_STRUCT(epage)) == NULL) {
			nni_mtx_unlock(&s->mtx);
			return (NNG_ENOMEM);
		}
		epage->code = code;
		nni_list_append(&s->errors, epage);
	}
	nni_strfree(epage->body);
	epage->body = body;
	nni_mtx_unlock(&s->errors_mtx);
	return (NNG_OK);
}